

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testArgumentParser.cxx
# Opt level: O2

Continue __thiscall
anon_unknown.dwarf_12986::Result::Func4(Result *this,string_view key,string_view arg)

{
  basic_string_view<char,_std::char_traits<char>_> __x;
  bool bVar1;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *this_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  allocator<char> local_51;
  string_view arg_local;
  string_view key_local;
  key_type local_30;
  
  arg_local._M_str = arg._M_str;
  arg_local._M_len = arg._M_len;
  key_local._M_str = key._M_str;
  key_local._M_len = key._M_len;
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&local_30,&key_local,&local_51);
  this_00 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
            std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
            ::operator[](&this->Func4_,&local_30);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::basic_string_view<char,std::char_traits<char>>&>(this_00,&arg_local);
  std::__cxx11::string::~string((string *)&local_30);
  __x._M_str = key_local._M_str;
  __x._M_len = key_local._M_len;
  __y._M_str = "FUNC_4b";
  __y._M_len = 7;
  bVar1 = std::operator==(__x,__y);
  return (Continue)bVar1;
}

Assistant:

ArgumentParser::Continue Func4(cm::string_view key, cm::string_view arg)
  {
    Func4_[std::string(key)].emplace_back(arg);
    return key == "FUNC_4b" ? ArgumentParser::Continue::Yes
                            : ArgumentParser::Continue::No;
  }